

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O0

void __thiscall
helics::CommsBroker<helics::tcp::TcpComms,_helics::CommonCore>::CommsBroker
          (CommsBroker<helics::tcp::TcpComms,_helics::CommonCore> *this)

{
  unique_ptr<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_> *in_RDI;
  CommsBroker<helics::tcp::TcpComms,_helics::CommonCore> *in_stack_00000080;
  undefined1 __i;
  
  CommonCore::CommonCore(&this->super_CommonCore);
  (in_RDI->_M_t).
  super___uniq_ptr_impl<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_>._M_t.
  super__Tuple_impl<0UL,_helics::tcp::TcpComms_*,_std::default_delete<helics::tcp::TcpComms>_>.
  super__Head_base<0UL,_helics::tcp::TcpComms_*,_false>._M_head_impl =
       (TcpComms *)&PTR__CommsBroker_00a578a8;
  in_RDI[1]._M_t.
  super___uniq_ptr_impl<helics::tcp::TcpComms,_std::default_delete<helics::tcp::TcpComms>_>._M_t.
  super__Tuple_impl<0UL,_helics::tcp::TcpComms_*,_std::default_delete<helics::tcp::TcpComms>_>.
  super__Head_base<0UL,_helics::tcp::TcpComms_*,_false>._M_head_impl =
       (TcpComms *)&PTR__CommsBroker_00a57c40;
  __i = 0;
  std::atomic<int>::atomic((atomic<int> *)in_RDI,0);
  std::unique_ptr<helics::tcp::TcpComms,std::default_delete<helics::tcp::TcpComms>>::
  unique_ptr<std::default_delete<helics::tcp::TcpComms>,void>(in_RDI);
  CLI::std::atomic<bool>::atomic((atomic<bool> *)in_RDI,(bool)__i);
  loadComms(in_stack_00000080);
  return;
}

Assistant:

CommsBroker<COMMS, BrokerT>::CommsBroker() noexcept
{
    static_assert(std::is_base_of<CommsInterface, COMMS>::value,
                  "COMMS object must be a CommsInterface Object");
    static_assert(std::is_base_of<BrokerBase, BrokerT>::value,
                  "Broker must be an object  with a base of BrokerBase");
    loadComms();
}